

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O0

bool wasm::Name::isIDChar(char c)

{
  iterator pvVar1;
  iterator __last;
  char *pcVar2;
  char local_a;
  bool local_9;
  char c_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'A') || ('Z' < c)) {
      if ((c < 'a') || ('z' < c)) {
        local_a = c;
        pvVar1 = std::array<char,_23UL>::begin(&isIDChar::otherIDChars);
        __last = std::array<char,_23UL>::end(&isIDChar::otherIDChars);
        pcVar2 = std::find<char*,char>(pvVar1,__last,&local_a);
        pvVar1 = std::array<char,_23UL>::end(&isIDChar::otherIDChars);
        local_9 = pcVar2 != pvVar1;
      }
      else {
        local_9 = true;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool Name::isIDChar(char c) {
  if ('0' <= c && c <= '9') {
    return true;
  }
  if ('A' <= c && c <= 'Z') {
    return true;
  }
  if ('a' <= c && c <= 'z') {
    return true;
  }
  static std::array<char, 23> otherIDChars = {
    {'!', '#', '$', '%', '&', '\'', '*', '+', '-', '.', '/', ':',
     '<', '=', '>', '?', '@', '\\', '^', '_', '`', '|', '~'}};
  return std::find(otherIDChars.begin(), otherIDChars.end(), c) !=
         otherIDChars.end();
}